

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsLinuxELFLinker::ScanDependencies
          (cmBinUtilsLinuxELFLinker *this,string *file,TargetType param_2)

{
  bool bVar1;
  uint16_t uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parentRpaths;
  cmELF elf;
  allocator<char> local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  cmELF local_58;
  string local_30;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmELF::cmELF(&local_58,(file->_M_dataplus)._M_p);
  bVar1 = cmELF::Valid(&local_58);
  if (bVar1) {
    uVar2 = cmELF::GetMachine(&local_58);
    if (uVar2 != 0) {
      if (this->Machine == 0) {
        uVar2 = cmELF::GetMachine(&local_58);
        this->Machine = uVar2;
      }
      else {
        uVar2 = cmELF::GetMachine(&local_58);
        if (uVar2 != this->Machine) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_30,"All files must have the same architecture.",&local_79);
          cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_30);
          std::__cxx11::string::~string((string *)&local_30);
          goto LAB_00475c77;
        }
      }
    }
    bVar1 = ScanDependencies(this,file,&local_78);
  }
  else {
LAB_00475c77:
    bVar1 = false;
  }
  cmELF::~cmELF(&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return bVar1;
}

Assistant:

bool cmBinUtilsLinuxELFLinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType /* unused */)
{
  std::vector<std::string> parentRpaths;

  cmELF elf(file.c_str());
  if (!elf) {
    return false;
  }
  if (elf.GetMachine() != 0) {
    if (this->Machine != 0) {
      if (elf.GetMachine() != this->Machine) {
        this->SetError("All files must have the same architecture.");
        return false;
      }
    } else {
      this->Machine = elf.GetMachine();
    }
  }

  return this->ScanDependencies(file, parentRpaths);
}